

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O2

void Io_ReadPlaMarkIdentical(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  word *pwVar1;
  word *pwVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  Vec_BitFill(vMarks,nCubes,nWords);
  uVar10 = 0;
  uVar9 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar9 = uVar10;
  }
  uVar5 = 0;
  if (0 < nCubes) {
    uVar5 = (ulong)(uint)nCubes;
  }
  do {
    if (uVar10 == uVar5) {
      return;
    }
    iVar3 = Vec_BitEntry(vMarks,(int)uVar10);
    uVar8 = uVar10;
    if (iVar3 == 0) {
LAB_002dc1de:
      uVar7 = uVar8;
      uVar8 = uVar7 + 1;
      iVar3 = (int)uVar8;
      if (iVar3 < nCubes) {
        iVar4 = Vec_BitEntry(vMarks,iVar3);
        if (iVar4 == 0) {
          uVar6 = 0;
          do {
            if (uVar9 == uVar6) {
              Vec_BitWriteEntry(vMarks,iVar3,(int)uVar6);
              break;
            }
            pwVar1 = pCs[uVar10] + uVar6;
            pwVar2 = pCs[uVar7 + 1] + uVar6;
            uVar6 = uVar6 + 1;
          } while (*pwVar1 == *pwVar2);
        }
        goto LAB_002dc1de;
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void Io_ReadPlaMarkIdentical( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                    if ( Abc_TtEqual(pCs[c1], pCs[c2], nWords) )
                        Vec_BitWriteEntry( vMarks, c2, 1 );
}